

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

void __thiscall
cmConditionEvaluator::HandleBinaryOp
          (cmConditionEvaluator *this,bool value,int *reducible,iterator *arg,
          cmArgumentList *newArgs,iterator *argP1,iterator *argP2)

{
  _List_node_base *p_Var1;
  undefined7 in_register_00000031;
  _Alloc_hider _Var2;
  string local_98;
  string local_78;
  cmExpandedCommandArgument local_58;
  
  if ((int)CONCAT71(in_register_00000031,value) == 0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"0","");
    cmExpandedCommandArgument::cmExpandedCommandArgument(&local_58,&local_98,true);
    p_Var1 = arg->_M_node;
    std::__cxx11::string::operator=((string *)(p_Var1 + 1),(string *)&local_58);
    *(bool *)&p_Var1[3]._M_next = local_58.Quoted;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.Value._M_dataplus._M_p != &local_58.Value.field_2) {
      operator_delete(local_58.Value._M_dataplus._M_p,
                      local_58.Value.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_003a42e1;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"1","");
    cmExpandedCommandArgument::cmExpandedCommandArgument(&local_58,&local_78,true);
    p_Var1 = arg->_M_node;
    std::__cxx11::string::operator=((string *)(p_Var1 + 1),(string *)&local_58);
    *(bool *)&p_Var1[3]._M_next = local_58.Quoted;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.Value._M_dataplus._M_p != &local_58.Value.field_2) {
      operator_delete(local_58.Value._M_dataplus._M_p,
                      local_58.Value.field_2._M_allocated_capacity + 1);
    }
    local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
    _Var2._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_003a42e1;
  }
  operator_delete(_Var2._M_p,local_98.field_2._M_allocated_capacity + 1);
LAB_003a42e1:
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
  _M_erase(newArgs,(iterator)argP2->_M_node);
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
  _M_erase(newArgs,(iterator)argP1->_M_node);
  p_Var1 = arg->_M_node;
  argP1->_M_node = p_Var1;
  if (p_Var1 != (_List_node_base *)newArgs) {
    p_Var1 = p_Var1->_M_next;
    argP1->_M_node = p_Var1;
    argP2->_M_node = p_Var1;
    if (argP1->_M_node != (_List_node_base *)newArgs) {
      argP2->_M_node = p_Var1->_M_next;
    }
  }
  *reducible = 1;
  return;
}

Assistant:

void cmConditionEvaluator::HandleBinaryOp(bool value, int& reducible,
                                          cmArgumentList::iterator& arg,
                                          cmArgumentList& newArgs,
                                          cmArgumentList::iterator& argP1,
                                          cmArgumentList::iterator& argP2)
{
  if (value) {
    *arg = cmExpandedCommandArgument("1", true);
  } else {
    *arg = cmExpandedCommandArgument("0", true);
  }
  newArgs.erase(argP2);
  newArgs.erase(argP1);
  argP1 = arg;
  this->IncrementArguments(newArgs, argP1, argP2);
  reducible = 1;
}